

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::~Recorder(Recorder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Endpoint *pEVar3;
  CloningFilter *pCVar4;
  
  (this->super_App)._vptr_App = (_func_int **)&PTR__Recorder_004b8970;
  saveFile(this,&(this->super_App).outFileName);
  pcVar2 = (this->mapfile)._M_dataplus._M_p;
  paVar1 = &(this->mapfile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->captureInterfaces);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  ~vector(&this->vStat);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->eptNames)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->eptids)._M_t);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->subkeys)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->subids)._M_t);
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~vector(&this->messages);
  pEVar3 = (this->cloneEndpoint)._M_t.
           super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
           super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
           super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
  if (pEVar3 != (Endpoint *)0x0) {
    (**(code **)((long)(pEVar3->super_Interface)._vptr_Interface + 8))();
  }
  (this->cloneEndpoint)._M_t.
  super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
  super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
  super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl = (Endpoint *)0x0;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::~deque(&this->endpoints);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->targets);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::~deque(&this->subscriptions);
  CLI::std::
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  ::~vector(&this->points);
  pCVar4 = (this->cFilt)._M_t.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  if (pCVar4 != (CloningFilter *)0x0) {
    (**(code **)(*(long *)&(pCVar4->super_Filter).super_Interface + 8))();
  }
  (this->cFilt)._M_t.
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = (CloningFilter *)0x0;
  apps::App::~App(&this->super_App);
  return;
}

Assistant:

Recorder::~Recorder()
{
    try {
        saveFile(outFileName);
    }
    catch (...) {
        // destructor should not throw
        ;
    }
}